

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O2

int __thiscall QRegularExpression::captureCount(QRegularExpression *this)

{
  bool bVar1;
  int iVar2;
  
  bVar1 = isValid(this);
  if (bVar1) {
    iVar2 = ((this->d).d.ptr)->capturingCount;
  }
  else {
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int QRegularExpression::captureCount() const
{
    if (!isValid()) // will compile the pattern
        return -1;
    return d->capturingCount;
}